

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyn_tbl.cpp
# Opt level: O0

void dyn_tbl_copy(dyn_tbl_t *dyn_tbl_from,dyn_tbl_t *dyn_tbl_to)

{
  unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
  *in_RSI;
  long in_RDI;
  unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
  *in_stack_ffffffffffffffe8;
  
  std::
  unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
  ::operator=(in_RSI,in_stack_ffffffffffffffe8);
  *(undefined4 *)((long)&in_RSI[1]._M_h._M_bucket_count + 4) = *(undefined4 *)(in_RDI + 0x44);
  in_RSI[1]._M_h._M_buckets = *(__buckets_ptr *)(in_RDI + 0x38);
  *(undefined4 *)&in_RSI[1]._M_h._M_bucket_count = *(undefined4 *)(in_RDI + 0x40);
  in_RSI[1]._M_h._M_element_count = *(size_type *)(in_RDI + 0x50);
  return;
}

Assistant:

void dyn_tbl_copy(dyn_tbl_t* dyn_tbl_from, dyn_tbl_t* dyn_tbl_to) {
	dyn_tbl_to->array = dyn_tbl_from->array;
	dyn_tbl_to->decrement = dyn_tbl_from->decrement;
	dyn_tbl_to->total = dyn_tbl_from->total;
	dyn_tbl_to->max_len = dyn_tbl_from->max_len;
	dyn_tbl_to->max_value = dyn_tbl_from->max_value;
}